

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
TransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++:1455:13),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++:1457:6)>
::getImpl(TransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_test_c__:1455:13),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_test_c__:1457:6)>
          *this,ExceptionOrValue *output)

{
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>_>
  depResult;
  ExceptionOr<kj::_::Void> local_390;
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>_>
  local_1f0;
  
  local_1f0.super_ExceptionOrValue.exception.ptr.isSet = false;
  local_1f0.value.ptr.isSet = false;
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,&local_1f0.super_ExceptionOrValue);
  if (local_1f0.super_ExceptionOrValue.exception.ptr.isSet == true) {
    *(this->errorHandler).returned = true;
    throwRecoverableException(&local_1f0.super_ExceptionOrValue.exception.ptr.field_1.value,0);
    local_390.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_390.value.ptr.isSet = true;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_390);
  }
  else {
    if (local_1f0.value.ptr.isSet != true) goto LAB_001e72e0;
    *(this->func).returned = true;
    local_390.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_390.value.ptr.isSet = true;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_390);
  }
  NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&local_390);
LAB_001e72e0:
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>_>::
  ~ExceptionOr(&local_1f0);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    // Derive return type from DepT to reduce templating.
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = handle<T>(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(depException)));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }